

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metadata_test.cc
# Opt level: O1

void __thiscall
google::protobuf::compiler::cpp::anon_unknown_0::CppMetadataTest_RangeChecksWork_Test::
~CppMetadataTest_RangeChecksWork_Test(CppMetadataTest_RangeChecksWork_Test *this)

{
  testing::Test::~Test((Test *)this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST_F(CppMetadataTest, RangeChecksWork) {
  absl::string_view test = "test";
  GeneratedCodeInfo::Annotation annotation;
  annotation.set_begin(-1);
  annotation.set_end(0);
  EXPECT_FALSE(atu::GetAnnotationSubstring(test, annotation).has_value());
  annotation.set_begin(1);
  EXPECT_FALSE(atu::GetAnnotationSubstring(test, annotation).has_value());
  annotation.set_begin(0);
  annotation.set_end(1);
  EXPECT_TRUE(atu::GetAnnotationSubstring(test, annotation).has_value());
  annotation.set_begin(4);
  annotation.set_end(4);
  ASSERT_TRUE(atu::GetAnnotationSubstring(test, annotation).has_value());
  EXPECT_EQ("", *atu::GetAnnotationSubstring(test, annotation));
  annotation.set_end(5);
  EXPECT_FALSE(atu::GetAnnotationSubstring(test, annotation).has_value());
}